

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::BuildDecompressedPathsImpl
          (CrateReader *this,BuildDecompressedPathsArg *arg)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  size_t sVar5;
  pointer pPVar6;
  _Bit_type *p_Var7;
  pointer pTVar8;
  pointer piVar9;
  pointer piVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  ostream *poVar13;
  char cVar14;
  unsigned_long *puVar15;
  unsigned_long *puVar16;
  _Elt_pointer puVar17;
  ulong uVar18;
  int iVar19;
  char *pcVar20;
  _Elt_pointer pPVar21;
  unsigned_long *in_R8;
  ulong uVar22;
  string *elem;
  long lVar23;
  unsigned_long *puVar24;
  ulong uVar25;
  bool bVar26;
  size_t idx;
  size_t subtreeStartIdx;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  ostringstream ss_e;
  Path parentPath;
  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  parentPathStack;
  Path rootPath;
  string local_4d8;
  string *local_4b8;
  string local_4b0;
  vector<int,_std::allocator<int>_> *local_490;
  unsigned_long *local_488 [2];
  unsigned_long local_478 [2];
  size_t local_468;
  pointer local_460;
  pointer local_458;
  vector<int,_std::allocator<int>_> *local_450;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_448;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_3f8;
  undefined1 local_3a0 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [12];
  Path local_228;
  _Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_158;
  Path local_100;
  
  if (arg == (BuildDecompressedPathsArg *)0x0) {
    bVar26 = false;
  }
  else {
    Path::Path(&local_228,&arg->parentPath);
    if ((((arg->pathIndexes == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) ||
         (local_450 = arg->elementTokenIndexes,
         local_450 == (vector<int,_std::allocator<int>_> *)0x0)) ||
        (local_490 = arg->jumps, local_490 == (vector<int,_std::allocator<int>_> *)0x0)) ||
       (pvVar4 = arg->visit_table, pvVar4 == (vector<bool,_std::allocator<bool>_> *)0x0)) {
      bVar26 = false;
    }
    else {
      local_4b0.field_2._8_8_ = arg->pathIndexes;
      Path::make_root_path();
      sVar5 = (this->_config).maxPathIndicesDecodeIteration;
      local_448._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_448._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_4b0.field_2._M_allocated_capacity = 0;
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_448,0);
      local_3f8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_3f8._M_impl.super__Deque_impl_data._M_map_size = 0;
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_3f8,0);
      local_158._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_map_size = 0;
      ::std::_Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::_M_initialize_map
                (&local_158,0);
      local_468 = sVar5;
      if (sVar5 != 0) {
        puVar15 = (unsigned_long *)arg->startIndex;
        uVar18 = arg->endIndex;
        local_458 = local_3a0 + 0xb0;
        local_460 = local_3a0 + 0x90;
        local_4b8 = &this->_err;
        local_4b0.field_2._M_allocated_capacity = 0;
        do {
          bVar26 = true;
          local_4b0._M_string_length = (size_type)puVar15;
          if (puVar15 < (unsigned_long *)(uVar18 + 1)) {
            do {
              local_4b0._M_string_length = (size_type)puVar15;
              if (((local_228._prim_part._M_string_length != 0) ||
                  (local_228._variant_part._M_string_length != 0)) ||
                 (local_228._prop_part._M_string_length != 0)) {
                piVar9 = (local_450->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (puVar15 < (unsigned_long *)
                              ((long)(local_450->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2))
                {
                  uVar2 = piVar9[(long)puVar15];
                  uVar11 = -uVar2;
                  if (0 < (int)uVar2) {
                    uVar11 = uVar2;
                  }
                  pTVar8 = (this->_tokens).
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)uVar11 <
                      (ulong)((long)(this->_tokens).
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 5))
                  {
                    uVar3 = *(uint *)(*(long *)local_4b0.field_2._8_8_ + (long)puVar15 * 4);
                    local_4b0._M_dataplus._M_p = (pointer)(ulong)uVar3;
                    puVar15 = (unsigned_long *)
                              (((long)(this->_paths).
                                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->_paths).
                                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              0x4ec4ec4ec4ec4ec5);
                    if (puVar15 < local_4b0._M_dataplus._M_p ||
                        (long)puVar15 - (long)local_4b0._M_dataplus._M_p == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"():",3);
                      iVar19 = 0x11b7;
                    }
                    else {
                      puVar15 = (unsigned_long *)
                                (((long)(this->_elemPaths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->_elemPaths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                0x4ec4ec4ec4ec4ec5);
                      if (local_4b0._M_dataplus._M_p <= puVar15 &&
                          (long)puVar15 - (long)local_4b0._M_dataplus._M_p != 0) {
                        p_Var7 = (pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        in_R8 = (unsigned_long *)
                                (ulong)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_offset;
                        if ((local_4b0._M_dataplus._M_p <
                             in_R8 + ((long)(pvVar4->super__Bvector_base<std::allocator<bool>_>).
                                            _M_impl.super__Bvector_impl_data._M_finish.
                                            super__Bit_iterator_base._M_p - (long)p_Var7)) &&
                           ((p_Var7[uVar3 >> 6] >> ((ulong)local_4b0._M_dataplus._M_p & 0x3f) & 1)
                            != 0)) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     ,0x56);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"[Crate]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"():",3);
                          iVar19 = 0x11c2;
                          goto LAB_001d7d03;
                        }
                        elem = &pTVar8[uVar11].str_;
                        if ((int)uVar2 < 0) {
                          Path::AppendProperty((Path *)local_3a0,&local_228,elem);
                        }
                        else {
                          Path::AppendElement((Path *)local_3a0,&local_228,elem);
                        }
                        Path::operator=((this->_paths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                        (long)local_4b0._M_dataplus._M_p,(Path *)local_3a0);
                        if (local_300._M_p != local_458) {
                          operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
                        }
                        if (local_320._M_p != local_460) {
                          operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_3a0._96_8_ != local_3a0 + 0x70) {
                          operator_delete((void *)local_3a0._96_8_,
                                          local_330._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_3a0._64_8_ != local_3a0 + 0x50) {
                          operator_delete((void *)local_3a0._64_8_,local_3a0._80_8_ + 1);
                        }
                        if ((undefined1 *)local_3a0._32_8_ != local_3a0 + 0x30) {
                          operator_delete((void *)local_3a0._32_8_,local_3a0._48_8_ + 1);
                        }
                        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                          operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
                        }
                        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
                        Path::Path((Path *)local_3a0,elem,&local_4d8);
                        Path::operator=((this->_elemPaths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                        (long)local_4b0._M_dataplus._M_p,(Path *)local_3a0);
                        if (local_300._M_p != local_458) {
                          operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
                        }
                        if (local_320._M_p != local_460) {
                          operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_3a0._96_8_ != local_3a0 + 0x70) {
                          operator_delete((void *)local_3a0._96_8_,
                                          local_330._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_3a0._64_8_ != local_3a0 + 0x50) {
                          operator_delete((void *)local_3a0._64_8_,local_3a0._80_8_ + 1);
                        }
                        if ((undefined1 *)local_3a0._32_8_ != local_3a0 + 0x30) {
                          operator_delete((void *)local_3a0._32_8_,local_3a0._48_8_ + 1);
                        }
                        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                          operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                          operator_delete(local_4d8._M_dataplus._M_p,
                                          local_4d8.field_2._M_allocated_capacity + 1);
                        }
                        goto LAB_001d6f0f;
                      }
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"():",3);
                      iVar19 = 0x11bc;
                    }
                    goto LAB_001d79d3;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x11ae);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  lVar23 = 0x31;
                  pcVar20 = "Invalid tokenIndex in BuildDecompressedPathsImpl.";
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x11a3);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  lVar23 = 0x28;
                  pcVar20 = "Index exceeds elementTokenIndexes.size()";
                }
LAB_001d79fb:
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,pcVar20,lVar23);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"\n",1);
LAB_001d7a14:
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append
                          ((char *)local_4b8,(ulong)local_4d8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
                ::std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
                bVar26 = false;
                goto LAB_001d7a70;
              }
              Path::operator=(&local_228,&local_100);
              if ((unsigned_long *)
                  ((long)*(pointer *)(local_4b0.field_2._8_8_ + 8) -
                   *(long *)local_4b0.field_2._8_8_ >> 2) <= local_4b0._M_string_length) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x118f);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                lVar23 = 0x20;
                pcVar20 = "Index exceeds pathIndexes.size()";
                goto LAB_001d79fb;
              }
              uVar2 = *(uint *)(*(long *)local_4b0.field_2._8_8_ + local_4b0._M_string_length * 4);
              local_4b0._M_dataplus._M_p = (pointer)(ulong)uVar2;
              pPVar6 = (this->_paths).
                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar15 = (unsigned_long *)
                        (((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                        0x4ec4ec4ec4ec4ec5);
              if (puVar15 < local_4b0._M_dataplus._M_p ||
                  (long)puVar15 - (long)local_4b0._M_dataplus._M_p == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3);
                iVar19 = 0x1195;
LAB_001d79d3:
                poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,iVar19);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                lVar23 = 0x15;
                pcVar20 = "Index is out-of-range";
                goto LAB_001d79fb;
              }
              p_Var7 = (pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              if ((local_4b0._M_dataplus._M_p <
                   (unsigned_long *)
                   ((ulong)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)p_Var7) * 8)) &&
                 ((p_Var7[uVar2 >> 6] >> ((ulong)local_4b0._M_dataplus._M_p & 0x3f) & 1) != 0)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3);
                iVar19 = 0x119b;
LAB_001d7d03:
                poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,iVar19);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                local_488[0] = local_478;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_488,
                           "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                           ,"");
                fmt::format<unsigned_long,unsigned_long>
                          (&local_4d8,(fmt *)local_488,&local_4b0,&local_4b0._M_string_length,in_R8)
                ;
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,local_4d8._M_dataplus._M_p,
                                     local_4d8._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                if (local_488[0] != local_478) {
                  operator_delete(local_488[0],local_478[0] + 1);
                }
                goto LAB_001d7a14;
              }
              Path::operator=(pPVar6 + (long)local_4b0._M_dataplus._M_p,&local_228);
LAB_001d6f0f:
              _Var12._M_p = local_4b0._M_dataplus._M_p + 0x3f;
              if (-1 < (long)local_4b0._M_dataplus._M_p) {
                _Var12._M_p = local_4b0._M_dataplus._M_p;
              }
              puVar1 = (pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       ((long)_Var12._M_p >> 6) +
                       (ulong)(((ulong)local_4b0._M_dataplus._M_p & 0x800000000000003f) <
                              0x8000000000000001) + 0xffffffffffffffff;
              *puVar1 = *puVar1 | 1L << ((byte)local_4b0._M_dataplus._M_p & 0x3f);
              piVar9 = (local_490->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar10 = (local_490->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              puVar15 = (unsigned_long *)((long)piVar10 - (long)piVar9 >> 2);
              if (puVar15 <= local_4b0._M_string_length) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3);
                iVar19 = 0x11d8;
                goto LAB_001d79d3;
              }
              iVar19 = piVar9[local_4b0._M_string_length];
              lVar23 = (long)iVar19;
              in_R8 = (unsigned_long *)CONCAT71((int7)((ulong)in_R8 >> 8),lVar23 < 1);
              cVar14 = '\0';
              if (lVar23 >= 1 || lVar23 == -1) {
                if (-1 < iVar19) {
                  puVar24 = (unsigned_long *)(lVar23 + local_4b0._M_string_length);
                  if (puVar24 < puVar15) {
                    piVar9 = (local_490->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    puVar16 = (unsigned_long *)((long)piVar10 - (long)piVar9 >> 2);
                    local_4b0._M_dataplus._M_p = (pointer)puVar24;
                    for (puVar15 = puVar24;
                        (puVar15 < puVar16 &&
                        (local_4b0._M_dataplus._M_p = (pointer)puVar15, -2 < piVar9[(long)puVar15]))
                        ; puVar15 = (unsigned_long *)((long)puVar15 + 1)) {
                      local_4b0._M_dataplus._M_p = (pointer)puVar16;
                    }
                    piVar9 = (local_490->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    local_488[0] = puVar24;
                    if ((unsigned_long *)((long)piVar10 - (long)piVar9 >> 2) <=
                        local_4b0._M_dataplus._M_p) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a0,"():",3);
                      poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x11fb);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                      lVar23 = 0x1d;
                      pcVar20 = "jump indices seems corrupted.";
                      goto LAB_001d7187;
                    }
                    cVar14 = '\0';
                    if (puVar24 <= local_4b0._M_dataplus._M_p) {
                      if (1 < piVar9[local_4b0._M_string_length]) {
                        local_3a0._0_8_ = local_4b0._M_string_length + 1;
                        if (local_448._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                            local_448._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                          ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                          _M_push_back_aux<unsigned_long>
                                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &local_448,(unsigned_long *)local_3a0);
                        }
                        else {
                          *local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                               local_3a0._0_8_;
                          local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                               local_448._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                        }
                        local_3a0._0_8_ = (long)puVar24 - 1;
                        if (local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                          ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                          _M_push_back_aux<unsigned_long>
                                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &local_3f8,(unsigned_long *)local_3a0);
                        }
                        else {
                          *local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                               local_3a0._0_8_;
                          local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                               local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                        }
                        uVar25 = (ulong)*(uint *)(*(long *)local_4b0.field_2._8_8_ +
                                                 local_4b0._M_string_length * 4);
                        pPVar6 = (this->_paths).
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar22 = ((long)(this->_paths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >>
                                 4) * 0x4ec4ec4ec4ec4ec5;
                        if (uVar22 < uVar25 || uVar22 - uVar25 == 0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                     ,0x56);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"():",3);
                          poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x120d);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"Index is out-of-range",0x15);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a0,"\n",1);
                          ::std::__cxx11::stringbuf::str();
                          ::std::__cxx11::string::_M_append
                                    ((char *)local_4b8,(ulong)local_4d8._M_dataplus._M_p);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                            operator_delete(local_4d8._M_dataplus._M_p,
                                            local_4d8.field_2._M_allocated_capacity + 1);
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
                          ::std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
                        }
                        else {
                          ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                                    ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                     &local_158,pPVar6 + uVar25);
                        }
                        cVar14 = '\x01';
                        if (uVar22 < uVar25 || uVar22 - uVar25 == 0) goto LAB_001d71ff;
                      }
                      if (local_448._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_448._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                        ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                        _M_push_back_aux<unsigned_long_const&>
                                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_448,
                                   (unsigned_long *)local_488);
                      }
                      else {
                        *local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                             (unsigned_long)local_488[0];
                        local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                             local_448._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                      }
                      if (local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_3f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                        ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                        _M_push_back_aux<unsigned_long_const&>
                                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_3f8,
                                   (unsigned_long *)&local_4b0);
                      }
                      else {
                        *local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                             (unsigned_long)local_4b0._M_dataplus._M_p;
                        local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                             local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                      }
                      ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                                ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 &local_158,&local_228);
                      local_4b0.field_2._M_allocated_capacity =
                           local_4b0.field_2._M_allocated_capacity + 1;
                      cVar14 = '\x04';
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,"():",3);
                    poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x11e6);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    lVar23 = 0x15;
                    pcVar20 = "jump index corrupted.";
LAB_001d7187:
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,pcVar20,lVar23);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a0,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)local_4b8,(ulong)local_4d8._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                      operator_delete(local_4d8._M_dataplus._M_p,
                                      local_4d8.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
                    ::std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
                    cVar14 = '\x01';
                  }
LAB_001d71ff:
                  if (cVar14 != '\0') goto LAB_001d7374;
                }
                uVar25 = (ulong)*(uint *)(*(long *)local_4b0.field_2._8_8_ +
                                         local_4b0._M_string_length * 4);
                pPVar6 = (this->_paths).
                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                         .super__Vector_impl_data._M_start;
                uVar22 = ((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                         0x4ec4ec4ec4ec4ec5;
                if (uVar22 < uVar25 || uVar22 - uVar25 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((Path *)local_3a0,0x1225);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a0,"Index is out-of-range",0x15);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append
                            ((char *)local_4b8,(ulong)local_4d8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                    operator_delete(local_4d8._M_dataplus._M_p,
                                    local_4d8.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
                  ::std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
                }
                else {
                  Path::operator=(&local_228,pPVar6 + uVar25);
                }
                cVar14 = uVar22 < uVar25 || uVar22 - uVar25 == 0;
              }
LAB_001d7374:
              if (cVar14 != '\0') goto LAB_001d7682;
              puVar15 = (unsigned_long *)(local_4b0._M_string_length + 1);
            } while (puVar15 < (unsigned_long *)(uVar18 + 1));
            cVar14 = '\x04';
            local_4b0._M_string_length = (size_type)puVar15;
LAB_001d7682:
            bVar26 = cVar14 == '\x04';
          }
LAB_001d7a70:
          if (!bVar26) goto LAB_001d7fcf;
          if (local_448._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_448._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          puVar17 = local_448._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_448._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_448._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar17 = local_448._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          puVar15 = (unsigned_long *)puVar17[-1];
          if (local_448._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_448._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_448._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_448._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_448._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_448._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_448._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_448._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_448._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_448._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_448._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_448._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          puVar17 = local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar17 = local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar18 = puVar17[-1];
          if (local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          pPVar21 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_158._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pPVar21 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 2;
          }
          Path::operator=(&local_228,pPVar21 + -1);
          ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::pop_back
                    ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158);
          local_4b0.field_2._M_allocated_capacity = local_4b0.field_2._M_allocated_capacity + 1;
        } while (local_4b0.field_2._M_allocated_capacity < local_468);
      }
      bVar26 = true;
      if (local_468 <= local_4b0.field_2._M_allocated_capacity) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0,"BuildDecompressedPathsImpl",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_3a0,0x1241);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0,"PathIndex tree Too deep.",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_4d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
        ::std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
LAB_001d7fcf:
        bVar26 = false;
      }
      ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~deque
                ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_3f8);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
        operator_delete(local_100._element._M_dataplus._M_p,
                        local_100._element.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_part_str._M_dataplus._M_p != &local_100._variant_part_str.field_2) {
        operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                        local_100._variant_part_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_selection_part._M_dataplus._M_p !=
          &local_100._variant_selection_part.field_2) {
        operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                        local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
        operator_delete(local_100._variant_part._M_dataplus._M_p,
                        local_100._variant_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
        operator_delete(local_100._prop_part._M_dataplus._M_p,
                        local_100._prop_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        local_100._prim_part.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._element._M_dataplus._M_p != &local_228._element.field_2) {
      operator_delete(local_228._element._M_dataplus._M_p,
                      local_228._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_part_str._M_dataplus._M_p != &local_228._variant_part_str.field_2) {
      operator_delete(local_228._variant_part_str._M_dataplus._M_p,
                      local_228._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_selection_part._M_dataplus._M_p !=
        &local_228._variant_selection_part.field_2) {
      operator_delete(local_228._variant_selection_part._M_dataplus._M_p,
                      local_228._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_part._M_dataplus._M_p != &local_228._variant_part.field_2) {
      operator_delete(local_228._variant_part._M_dataplus._M_p,
                      local_228._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._prop_part._M_dataplus._M_p != &local_228._prop_part.field_2) {
      operator_delete(local_228._prop_part._M_dataplus._M_p,
                      local_228._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._prim_part._M_dataplus._M_p != &local_228._prim_part.field_2) {
      operator_delete(local_228._prim_part._M_dataplus._M_p,
                      local_228._prim_part.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar26;
}

Assistant:

bool CrateReader::BuildDecompressedPathsImpl(
    BuildDecompressedPathsArg *arg) {

  if (!arg) {
    return false;
  }

  Path parentPath = arg->parentPath;
  if (!arg->pathIndexes) {
    return false;
  }
  if (!arg->elementTokenIndexes) {
    return false;
  }
  if (!arg->jumps) {
    return false;
  }
  if (!arg->visit_table) {
    return false;
  }
  auto &pathIndexes = *arg->pathIndexes;
  auto &elementTokenIndexes = *arg->elementTokenIndexes;
  auto &jumps = *arg->jumps;
  auto &visit_table = *arg->visit_table;

  auto rootPath = Path::make_root_path();

  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;
  std::stack<Path> parentPathStack;

  size_t nIter = 0;

  size_t startIndex = arg->startIndex;
  size_t endIndex = arg->endIndex;

  while (nIter < maxIter) {

    DCOUT("startIndex = " << startIndex << ", endIdx = " << endIndex);

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      //auto thisIndex = curIndex++;
      DCOUT("thisIndex = " << thisIndex << ", pathIndexes.size = " << pathIndexes.size());
      if (parentPath.is_empty()) {
        // root node.
        // Assume single root node in the scene.
        DCOUT("paths[" << pathIndexes[thisIndex]
                       << "] is parent. name = " << parentPath.full_path_name());
        parentPath = rootPath;

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR("Index exceeds pathIndexes.size()");
          return false;
        }

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        _paths[idx] = parentPath;
        visit_table[idx] = true;
      } else {
        if (thisIndex >= elementTokenIndexes.size()) {
          PUSH_ERROR("Index exceeds elementTokenIndexes.size()");
          return false;
        }
        int32_t _tokenIndex = elementTokenIndexes[thisIndex];
        DCOUT("elementTokenIndex = " << _tokenIndex);
        bool isPrimPropertyPath = _tokenIndex < 0;
        // ~0 returns -2147483648, so cast to uint32
        uint32_t tokenIndex = uint32_t(isPrimPropertyPath ? -_tokenIndex : _tokenIndex);

        DCOUT("tokenIndex = " << tokenIndex << ", _tokens.size = " << _tokens.size());
        if (tokenIndex >= _tokens.size()) {
          PUSH_ERROR("Invalid tokenIndex in BuildDecompressedPathsImpl.");
          return false;
        }
        auto const &elemToken = _tokens[size_t(tokenIndex)];
        DCOUT("elemToken = " << elemToken);
        DCOUT("[" << pathIndexes[thisIndex] << "].append = " << elemToken);

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx >= _elemPaths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        // Reconstruct full path
        _paths[idx] =
            isPrimPropertyPath ? parentPath.AppendProperty(elemToken.str())
                               : parentPath.AppendElement(elemToken.str()); // prim, variantSelection, etc.

        // also set leaf path for 'primChildren' check
        _elemPaths[idx] = Path(elemToken.str(), "");
        //_paths[pathIndexes[thisIndex]].SetLocalPart(elemToken.str());

        visit_table[idx] = true;
      }

      // If we have either a child or a sibling but not both, then just
      // continue to the neighbor.  If we have both then spawn a task for the
      // sibling and do the child ourself.  We think that our path trees tend
      // to be broader more often than deep.

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR("Index is out-of-range");
        return false;
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);
      DCOUT("hasChild = " << hasChild << ", hasSibling = " << hasSibling);

      if (hasChild) {
        if (hasSibling) {
          // NOTE(syoyo): This recursive call can be parallelized
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {

                // Setup stacks to resume loop from [Cont.]
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.

                {
                  size_t idx = pathIndexes[thisIndex];
                  if (idx >= _paths.size()) {
                    PUSH_ERROR("Index is out-of-range");
                    return false;
                  }

                  parentPathStack.push(_paths[idx]);
                }
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);

            parentPathStack.push(parentPath);
            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }

        // [Cont.]
        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        parentPath = _paths[idx];

      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentPath = parentPathStack.top();
    parentPathStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}